

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase80::run(TestCase80 *this)

{
  int *local_68;
  int *local_60;
  bool local_51;
  int *piStack_50;
  bool _kj_shouldLog;
  int *i2;
  int *local_38;
  int *i1;
  Arena arena;
  TestCase80 *this_local;
  
  arena.currentChunk = (ChunkHeader *)this;
  Arena::Arena((Arena *)&i1,0x400);
  local_38 = Arena::allocate<int>((Arena *)&i1);
  piStack_50 = Arena::allocate<int>((Arena *)&i1);
  if (local_38 + 1 != piStack_50) {
    local_51 = _::Debug::shouldLog(ERROR);
    while (local_51 != false) {
      local_60 = local_38 + 1;
      local_68 = piStack_50;
      _::Debug::log<char_const(&)[36],int*,int*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x57,ERROR,"\"failed: expected \" \"(&i1 + 1) == (&i2)\", &i1 + 1, &i2",
                 (char (*) [36])"failed: expected (&i1 + 1) == (&i2)",&local_60,&local_68);
      local_51 = false;
    }
  }
  Arena::~Arena((Arena *)&i1);
  return;
}

Assistant:

TEST(Arena, TrivialObject) {
  Arena arena;

  int& i1 = arena.allocate<int>();
  int& i2 = arena.allocate<int>();

  // Trivial objects should be tightly-packed.
  EXPECT_EQ(&i1 + 1, &i2);
}